

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O0

void Bmc_ManBCoreCollect_rec(Gia_Man_t *p,int Id,int f,Vec_Int_t *vNodes,Vec_Int_t *vRootsNew)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRootsNew_local;
  Vec_Int_t *vNodes_local;
  int f_local;
  int Id_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,Id);
    pGVar2 = Gia_ManObj(p,Id);
    Bmc_ManBCoreAssignVar(p,pGVar2,f,vNodes);
    iVar1 = Gia_ObjIsPi(p,pGVar2);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsRo(p,pGVar2);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pGVar2);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                        ,0x71,
                        "void Bmc_ManBCoreCollect_rec(Gia_Man_t *, int, int, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar1 = Gia_ObjFaninId0p(p,pGVar2);
        Bmc_ManBCoreCollect_rec(p,iVar1,f,vNodes,vRootsNew);
        iVar1 = Gia_ObjFaninId1p(p,pGVar2);
        Bmc_ManBCoreCollect_rec(p,iVar1,f,vNodes,vRootsNew);
      }
      else {
        pGVar2 = Gia_ObjRoToRi(p,pGVar2);
        iVar1 = Gia_ObjId(p,pGVar2);
        Vec_IntPush(vRootsNew,iVar1);
      }
    }
  }
  return;
}

Assistant:

void Bmc_ManBCoreCollect_rec( Gia_Man_t * p, int Id, int f, Vec_Int_t * vNodes, Vec_Int_t * vRootsNew )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    Bmc_ManBCoreAssignVar( p, pObj, f, vNodes );
    if ( Gia_ObjIsPi(p, pObj) )
        return;
    if ( Gia_ObjIsRo(p, pObj) )
    {
        Vec_IntPush( vRootsNew, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId0p(p, pObj), f, vNodes, vRootsNew );
    Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId1p(p, pObj), f, vNodes, vRootsNew );
}